

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O3

plutovg_surface_t * plutovg_surface_load_from_image_base64(char *data,int length)

{
  byte bVar1;
  size_t sVar2;
  void *data_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  plutovg_surface_t *ppVar7;
  
  sVar2 = (size_t)(uint)length;
  if (length == -1) {
    sVar2 = strlen(data);
  }
  data_00 = malloc((long)(int)sVar2);
  if (data_00 == (void *)0x0) {
    return (plutovg_surface_t *)0x0;
  }
  if (0 < (int)sVar2) {
    ppVar7 = (plutovg_surface_t *)0x0;
    uVar5 = 0;
    uVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = data[uVar5];
      uVar6 = (ulong)bVar1;
      if (uVar6 == 0x3d) {
        uVar3 = uVar3 + 1;
      }
      else if ((((byte)(bVar1 - 0x30) < 10) || ((bVar1 & 0xfb) == 0x2b)) ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        if (uVar3 != 0) goto LAB_0012d086;
        *(uint8_t *)((long)data_00 + lVar4) = ""[uVar6];
        lVar4 = lVar4 + 1;
        uVar3 = 0;
      }
      else if ((0x20 < bVar1) || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0)) goto LAB_0012d086;
      uVar5 = uVar5 + 1;
    } while ((sVar2 & 0xffffffff) != uVar5);
    ppVar7 = (plutovg_surface_t *)0x0;
    if (((((uint)lVar4 & 3) == 1) || (lVar4 == 0)) || (2 < uVar3)) goto LAB_0012d086;
    uVar3 = lVar4 - (lVar4 + 3U >> 2);
    if (uVar3 != 0) {
      if ((uVar3 < 2) || (uVar3 == 2)) {
        lVar4 = 0;
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        lVar4 = 0;
        do {
          *(byte *)((long)data_00 + uVar5) =
               *(byte *)((long)data_00 + lVar4 + 1) >> 4 & 3 | *(char *)((long)data_00 + lVar4) << 2
          ;
          *(byte *)((long)data_00 + uVar5 + 1) =
               *(byte *)((long)data_00 + lVar4 + 2) >> 2 & 0xf |
               *(char *)((long)data_00 + lVar4 + 1) << 4;
          *(byte *)((long)data_00 + uVar5 + 2) =
               *(byte *)((long)data_00 + lVar4 + 3) & 0x3f |
               *(char *)((long)data_00 + lVar4 + 2) << 6;
          lVar4 = lVar4 + 4;
          uVar5 = uVar5 + 3;
        } while (uVar5 < uVar3 - 2);
      }
      if (uVar5 < uVar3) {
        *(byte *)((long)data_00 + uVar5) =
             *(byte *)((long)data_00 + lVar4 + 1) >> 4 & 3 | *(char *)((long)data_00 + lVar4) << 2;
      }
      if (uVar5 + 1 < uVar3) {
        *(byte *)((long)data_00 + uVar5 + 1) =
             *(byte *)((long)data_00 + lVar4 + 2) >> 2 & 0xf |
             *(char *)((long)data_00 + lVar4 + 1) << 4;
      }
      ppVar7 = plutovg_surface_load_from_image_data(data_00,(int)uVar3);
      goto LAB_0012d086;
    }
  }
  ppVar7 = (plutovg_surface_t *)0x0;
LAB_0012d086:
  free(data_00);
  return ppVar7;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_base64(const char* data, int length)
{
    plutovg_surface_t* surface = NULL;
    uint8_t* output_data = NULL;
    size_t output_length = 0;

    size_t equals_sign_count = 0;
    size_t sidx = 0;
    size_t didx = 0;

    if(length == -1)
        length = strlen(data);
    output_data = malloc(length);
    if(output_data == NULL)
        return NULL;
    for(int i = 0; i < length; ++i) {
        uint8_t cc = data[i];
        if(cc == '=') {
            ++equals_sign_count;
        } else if(cc == '+' || cc == '/' || PLUTOVG_IS_ALNUM(cc)) {
            if(equals_sign_count > 0)
                goto cleanup;
            output_data[output_length++] = base64_table[cc];
        } else if(!PLUTOVG_IS_WS(cc)) {
            goto cleanup;
        }
    }

    if(output_length == 0 || equals_sign_count > 2 || (output_length % 4) == 1)
        goto cleanup;
    output_length -= (output_length + 3) / 4;
    if(output_length == 0) {
        goto cleanup;
    }

    if(output_length > 1) {
        while(didx < output_length - 2) {
            output_data[didx + 0] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
            output_data[didx + 1] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
            output_data[didx + 2] = (((output_data[sidx + 2] << 6) & 255) | ((output_data[sidx + 3] >> 0) & 077));
            sidx += 4;
            didx += 3;
        }
    }

    if(didx < output_length)
        output_data[didx] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
    if(++didx < output_length) {
        output_data[didx] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
    }

    surface = plutovg_surface_load_from_image_data(output_data, output_length);
cleanup:
    free(output_data);
    return surface;
}